

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<std::complex<long_double>_>::Expand
          (TPZFrontNonSym<std::complex<long_double>_> *this,int larger)

{
  complex<long_double> *pcVar1;
  complex<long_double> *pcVar2;
  int in_ESI;
  long in_RDI;
  complex<long_double> *unaff_retaddr;
  int64_t in_stack_00000008;
  TPZVec<std::complex<long_double>_> *in_stack_00000010;
  int64_t j;
  int64_t i;
  long local_48;
  long local_40;
  complex<long_double> local_38;
  int local_c;
  
  local_c = in_ESI;
  std::complex<long_double>::complex(&local_38,(longdouble)0,(longdouble)0);
  TPZVec<std::complex<long_double>_>::Resize(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  local_48 = *(long *)(in_RDI + 0xa0);
  while (local_48 = local_48 + -1, -1 < local_48) {
    local_40 = *(long *)(in_RDI + 0xa0);
    while (local_40 = local_40 + -1, -1 < local_40) {
      pcVar1 = TPZVec<std::complex<long_double>_>::operator[]
                         ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0xf8),
                          local_48 * *(int *)(in_RDI + 0xc) + local_40);
      pcVar2 = TPZVec<std::complex<long_double>_>::operator[]
                         ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0xf8),
                          local_48 * local_c + local_40);
      *(undefined8 *)pcVar2->_M_value = *(undefined8 *)pcVar1->_M_value;
      *(undefined8 *)(pcVar2->_M_value + 8) = *(undefined8 *)(pcVar1->_M_value + 8);
      *(undefined8 *)(pcVar2->_M_value + 0x10) = *(undefined8 *)(pcVar1->_M_value + 0x10);
      *(undefined8 *)(pcVar2->_M_value + 0x18) = *(undefined8 *)(pcVar1->_M_value + 0x18);
      if (local_48 != 0) {
        pcVar1 = TPZVec<std::complex<long_double>_>::operator[]
                           ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0xf8),
                            local_48 * *(int *)(in_RDI + 0xc) + local_40);
        std::complex<long_double>::operator=(pcVar1,(longdouble)0);
      }
    }
  }
  *(int *)(in_RDI + 0xc) = local_c;
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Expand(int larger) {
	//	PrintGlobal("Antes do Expande");
	this->fData.Resize(larger*larger,0.);
    int64_t i,j;
	for(j=this->fFront-1;j>=0;j--){
		for(i=this->fFront-1;i>=0;i--){
			this->fData[j*larger + i]=this->fData[j*this->fMaxFront + i];
			if(j) this->fData[j*this->fMaxFront+i] = 0.;
		}
	}
	this->fMaxFront = larger;
}